

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcEncrypt.c
# Opt level: O0

void cbc256Encrypt(ThreefishKey_t *key,uint64_t *iv,uint64_t *plain_text,uint64_t num_blocks)

{
  uint64_t offset;
  uint64_t block;
  uint64_t num_blocks_local;
  uint64_t *plain_text_local;
  uint64_t *iv_local;
  ThreefishKey_t *key_local;
  
  *plain_text = *iv ^ *plain_text;
  plain_text[1] = iv[1] ^ plain_text[1];
  plain_text[2] = iv[2] ^ plain_text[2];
  plain_text[3] = iv[3] ^ plain_text[3];
  for (offset = 0; offset < num_blocks << 2; offset = offset + 4) {
    if (offset != 0) {
      plain_text[offset] = plain_text[offset - 4] ^ plain_text[offset];
      plain_text[offset + 1] = plain_text[offset - 3] ^ plain_text[offset + 1];
      plain_text[offset + 2] = plain_text[offset - 2] ^ plain_text[offset + 2];
      plain_text[offset + 3] = plain_text[offset - 1] ^ plain_text[offset + 3];
    }
    threefishEncryptBlockWords(key,plain_text + offset,plain_text + offset);
  }
  return;
}

Assistant:

void cbc256Encrypt(ThreefishKey_t* key,
                   const uint64_t* iv,
                   uint64_t* plain_text,
                   const uint64_t num_blocks)
{
    //xor the initialization vector with the first block of input
    plain_text[0] ^= iv[0]; plain_text[1] ^= iv[1];
    plain_text[2] ^= iv[2]; plain_text[3] ^= iv[3];

    //run each block through the cipher chaining on the previous block 
    for(uint64_t block=0; block<(num_blocks*SAFE_SLICE); block+=SAFE_SLICE)
    {
        if(block > 0) //feedback the previous into the next block by xoring them together
        {
            const uint64_t offset = block-SAFE_SLICE;
            plain_text[block] ^= plain_text[offset];
            plain_text[block+1] ^= plain_text[offset+1];
            plain_text[block+2] ^= plain_text[offset+2];
            plain_text[block+3] ^= plain_text[offset+3];
        }

        //run the current block through the cipher
        threefishEncryptBlockWords(key, &plain_text[block], &plain_text[block]);
    }
}